

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expand_zstd.c
# Opt level: O1

void test_expand_zstd(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  extract_reference_file("test_expand.zst");
  wVar1 = systemf("%s %s >test.out 2>test.err",testprog,"test_expand.zst");
  if (wVar1 != L'\0') {
    wVar2 = canZstd();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_zstd.c"
                     ,L'\x15');
      test_skipping("It seems zstd is not supported on this platform");
      return;
    }
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_zstd.c"
                      ,L'\x11',0,"0",(long)wVar1,"f",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_zstd.c"
             ,L'\x12',"contents of test_expand.zst.\n","test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cat/test/test_expand_zstd.c"
             ,L'\x13',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_expand_zstd)
{
	const char *reffile = "test_expand.zst";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canZstd()) {
		assertEqualInt(0, f);
		assertTextFileContents("contents of test_expand.zst.\n", "test.out");
		assertEmptyFile("test.err");
	} else {
		skipping("It seems zstd is not supported on this platform");
	}
}